

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::Rollup::Add(Rollup *this,Rollup *other)

{
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
  *this_00;
  pointer pRVar2;
  Rollup *in_RSI;
  long *in_RDI;
  mapped_type *child;
  value_type *other_child;
  const_iterator __end2;
  const_iterator __begin2;
  ChildMap *__range2;
  pointer in_stack_ffffffffffffff98;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  local_20;
  Rollup *other_00;
  
  *in_RDI = in_RSI->vm_total_ + *in_RDI;
  in_RDI[1] = in_RSI->file_total_ + in_RDI[1];
  other_00 = (Rollup *)&in_RSI->children_;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
                *)in_stack_ffffffffffffff98);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
              *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
    ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
                 *)0x180525);
    this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
               *)std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>_>
                 ::operator[](in_stack_ffffffffffffffa0,(key_type *)in_stack_ffffffffffffff98);
    pRVar2 = std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::get
                       ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)
                        in_stack_ffffffffffffffa0);
    if (pRVar2 == (pointer)0x0) {
      operator_new(0x60);
      Rollup((Rollup *)0x180576);
      std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::reset
                ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)this_00,
                 in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa0 = this_00;
    }
    in_stack_ffffffffffffff98 =
         std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::operator->
                   ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)0x1805b2);
    std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>::operator*
              ((unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_> *)
               in_stack_ffffffffffffffa0);
    Add(in_RSI,other_00);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_false,_true>
                  *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void Add(const Rollup& other) {
    vm_total_ += other.vm_total_;
    file_total_ += other.file_total_;

    for (const auto& other_child : other.children_) {
      auto& child = children_[other_child.first];
      if (child.get() == NULL) {
        child.reset(new Rollup());
      }
      child->Add(*other_child.second);
    }
  }